

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

JBTIndex __thiscall
anon_unknown.dwarf_1c99998::BacktraceData::Add(BacktraceData *this,cmListFileBacktrace *bt)

{
  ulong uVar1;
  cmListFileContext *value;
  bool bVar2;
  JBTIndex value_00;
  ArrayIndex AVar3;
  _Hash_node_base *p_Var4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var5;
  Value *pVVar6;
  mapped_type *pmVar7;
  __hash_code __code;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  string *__k;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar11;
  cmListFileContext *top;
  ArrayIndex fileIndex;
  ArrayIndex cmdIndex;
  Value entry;
  cmListFileContext *local_d8;
  undefined1 local_d0 [44];
  ArrayIndex local_a4;
  string local_a0;
  Value local_80;
  Value local_58;
  
  bVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  AVar3 = 0xffffffff;
  if (!bVar2) {
    local_d8 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                         (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    uVar1 = (this->NodeMap)._M_h._M_bucket_count;
    uVar8 = (ulong)local_d8 % uVar1;
    p_Var9 = (this->NodeMap)._M_h._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var9->_M_nxt, p_Var10 = p_Var9,
       local_d8 != (cmListFileContext *)p_Var9->_M_nxt[1]._M_nxt)) {
      while (p_Var9 = p_Var4, p_Var4 = p_Var9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar8) ||
           (p_Var10 = p_Var9, local_d8 == (cmListFileContext *)p_Var4[1]._M_nxt)) goto LAB_00483dd2;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_00483dd2:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var10->_M_nxt;
    }
    if (p_Var4 == (_Hash_node_base *)0x0) {
      Json::Value::Value(&local_80,objectValue);
      __k = &local_d8->FilePath;
      _Var5._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->FileMap)._M_h,__k);
      if (_Var5._M_cur == (__node_type *)0x0) {
        local_a4 = Json::Value::size(&this->Files);
        pVar11 = std::
                 _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                           ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)&this->FileMap,__k);
        _Var5._M_cur = (__node_type *)
                       pVar11.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                       ._M_cur;
        cmSystemTools::RelativeIfUnder(&local_a0,&this->TopSource,__k);
        Json::Value::Value((Value *)local_d0,&local_a0);
        Json::Value::append(&this->Files,(Value *)local_d0);
        Json::Value::~Value((Value *)local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(ArrayIndex)local_a0._M_dataplus._M_p) !=
            &local_a0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                   (ArrayIndex)local_a0._M_dataplus._M_p),
                          local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      Json::Value::Value(&local_58,
                         *(UInt *)((long)&((_Var5._M_cur)->
                                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                          ._M_storage._M_storage + 0x20));
      pVVar6 = Json::Value::operator[](&local_80,"file");
      Json::Value::operator=(pVVar6,&local_58);
      Json::Value::~Value(&local_58);
      if (local_d8->Line != 0) {
        Json::Value::Value((Value *)local_d0,(Int)local_d8->Line);
        pVVar6 = Json::Value::operator[](&local_80,"line");
        Json::Value::operator=(pVVar6,(Value *)local_d0);
        Json::Value::~Value((Value *)local_d0);
      }
      value = local_d8;
      if ((local_d8->Name)._M_string_length != 0) {
        _Var5._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->CommandMap)._M_h,&local_d8->Name);
        if (_Var5._M_cur == (__node_type *)0x0) {
          local_a0._M_dataplus._M_p._0_4_ = Json::Value::size(&this->Commands);
          pVar11 = std::
                   _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                   ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                             ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                               *)&this->CommandMap,value);
          _Var5._M_cur = (__node_type *)
                         pVar11.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                         ._M_cur;
          Json::Value::Value((Value *)local_d0,&value->Name);
          Json::Value::append(&this->Commands,(Value *)local_d0);
          Json::Value::~Value((Value *)local_d0);
        }
        Json::Value::Value(&local_58,
                           *(UInt *)((long)&((_Var5._M_cur)->
                                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                            ._M_storage._M_storage + 0x20));
        pVVar6 = Json::Value::operator[](&local_80,"command");
        Json::Value::operator=(pVVar6,&local_58);
        Json::Value::~Value(&local_58);
      }
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_d0);
      value_00 = Add(this,(cmListFileBacktrace *)local_d0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
      }
      if (value_00.Index != 0xffffffff) {
        Json::Value::Value((Value *)local_d0,value_00.Index);
        pVVar6 = Json::Value::operator[](&local_80,"parent");
        Json::Value::operator=(pVVar6,(Value *)local_d0);
        Json::Value::~Value((Value *)local_d0);
      }
      AVar3 = Json::Value::size(&this->Nodes);
      pmVar7 = std::__detail::
               _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->NodeMap,&local_d8);
      *pmVar7 = AVar3;
      Json::Value::append(&this->Nodes,&local_80);
      Json::Value::~Value(&local_80);
    }
    else {
      AVar3 = *(ArrayIndex *)&p_Var4[2]._M_nxt;
    }
  }
  return (JBTIndex)AVar3;
}

Assistant:

JBTIndex BacktraceData::Add(cmListFileBacktrace const& bt)
{
  JBTIndex index;
  if (bt.Empty()) {
    return index;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index.Index = found->second;
    return index;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  if (JBTIndex parent = this->Add(bt.Pop())) {
    entry["parent"] = parent.Index;
  }
  index.Index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return index;
}